

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowingArray.h
# Opt level: O2

void __thiscall
JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::EnsureArray
          (GrowingArray<unsigned_int,_Memory::HeapAllocator> *this)

{
  uint uVar1;
  uint32 uVar2;
  Memory *pMVar3;
  uint *puVar4;
  ulong count;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  if (this->buffer == (Type)0x0) {
    data.plusSize = (size_t)this->length;
    local_50 = (undefined1  [8])&unsigned_int::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_25f738b;
    data.filename._0_4_ = 0x62;
    pMVar3 = (Memory *)Memory::HeapAllocator::TrackAllocInfo(this->alloc,(TrackAllocData *)local_50)
    ;
    puVar4 = Memory::AllocateArray<Memory::HeapAllocator,unsigned_int,false>
                       (pMVar3,(HeapAllocator *)Memory::HeapAllocator::Alloc,0,(ulong)this->length);
    this->buffer = puVar4;
    this->count = 0;
  }
  else if (this->count == this->length) {
    uVar2 = UInt32Math::AddMul<1u,2u>(this->count);
    count = (ulong)uVar2;
    local_50 = (undefined1  [8])&unsigned_int::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_25f738b;
    data.filename._0_4_ = 0x6b;
    data.plusSize = count;
    pMVar3 = (Memory *)Memory::HeapAllocator::TrackAllocInfo(this->alloc,(TrackAllocData *)local_50)
    ;
    puVar4 = Memory::AllocateArray<Memory::HeapAllocator,unsigned_int,false>
                       (pMVar3,(HeapAllocator *)Memory::HeapAllocator::Alloc,0,count);
    Memory::CopyArray<unsigned_int,unsigned_int,Memory::HeapAllocator>
              (puVar4,count,this->buffer,(ulong)this->length);
    uVar1 = this->length;
    if ((ulong)uVar1 != 0) {
      if (0x3fffffff < uVar1) {
        Math::DefaultOverflowPolicy();
      }
      Memory::HeapAllocator::Free(this->alloc,this->buffer,(ulong)uVar1 << 2);
    }
    this->length = uVar2;
    this->buffer = puVar4;
  }
  return;
}

Assistant:

void EnsureArray()
        {
            if (buffer == nullptr)
            {
                buffer = AllocateArray<AllocatorType, TValue, false>(
                    TRACK_ALLOC_INFO(alloc, TValue, AllocatorType, 0, length),
                    TypeAllocatorFunc<TAllocator, TValue>::GetAllocFunc(),
                    length);
                count = 0;
            }
            else if (count == length)
            {
                uint32 newLength = UInt32Math::AddMul<1, 2>(length);
                TValue * newbuffer = AllocateArray<AllocatorType, TValue, false>(
                    TRACK_ALLOC_INFO(alloc, TValue, AllocatorType, 0, newLength),
                    TypeAllocatorFunc<TAllocator, TValue>::GetAllocFunc(),
                    newLength);
                CopyArray<TValue, TValue, TAllocator>(newbuffer, newLength, buffer, length);
#ifdef DIAG_MEM
                listFreeAmount += length;
#endif
                if (length != 0)
                {
                    const size_t lengthByteSize = UInt32Math::Mul(length, sizeof(TValue));
                    AllocatorFree(alloc, (TypeAllocatorFunc<TAllocator, int>::GetFreeFunc()), buffer, lengthByteSize);
                }
                length = newLength;
                buffer = newbuffer;
            }
        }